

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O1

void __thiscall nuraft::stat_mgr::~stat_mgr(stat_mgr *this)

{
  stat_elem *this_00;
  _Rb_tree_node_base *p_Var1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->stat_map_lock_;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  for (p_Var1 = (this->stat_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->stat_map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(stat_elem **)(p_Var1 + 2);
    if (this_00 != (stat_elem *)0x0) {
      stat_elem::~stat_elem(this_00);
      operator_delete(this_00);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  ::clear(&(this->stat_map_)._M_t);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nuraft::stat_elem_*>_>_>
  ::~_Rb_tree(&(this->stat_map_)._M_t);
  return;
}

Assistant:

stat_mgr::~stat_mgr() {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    for (auto& entry: stat_map_) {
        delete entry.second;
    }
    stat_map_.clear();
}